

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O0

void Amap_RemoveComments(char *pBuffer,int *pnDots,int *pnLines)

{
  int local_30;
  int local_2c;
  int nLines;
  int nDots;
  char *pCur;
  int *pnLines_local;
  int *pnDots_local;
  char *pBuffer_local;
  
  local_30 = 0;
  local_2c = 0;
  for (_nLines = pBuffer; *_nLines != '\0'; _nLines = _nLines + 1) {
    if (*_nLines == '#') {
      while (*_nLines != '\n') {
        *_nLines = ' ';
        _nLines = _nLines + 1;
      }
    }
    if (*_nLines == '\n') {
      if (_nLines[-1] == '\r') {
        if (_nLines[-2] == '\\') {
          _nLines[-2] = ' ';
          _nLines[-1] = ' ';
          *_nLines = ' ';
        }
        else {
          local_30 = local_30 + 1;
        }
      }
      else if (_nLines[-1] == '\\') {
        _nLines[-1] = ' ';
        *_nLines = ' ';
      }
      else {
        local_30 = local_30 + 1;
      }
    }
    else if (*_nLines == '.') {
      local_2c = local_2c + 1;
    }
  }
  if (pnDots != (int *)0x0) {
    *pnDots = local_2c;
  }
  if (pnLines != (int *)0x0) {
    *pnLines = local_30;
  }
  return;
}

Assistant:

void Amap_RemoveComments( char * pBuffer, int * pnDots, int * pnLines )
{
    char * pCur;
    int nDots, nLines;
    // scan through the buffer and eliminate comments
    // (in the BLIF file, comments are lines starting with "#")
    nDots = nLines = 0;
    for ( pCur = pBuffer; *pCur; pCur++ )
    {
        // if this is the beginning of comment
        // clean it with spaces until the new line statement
        if ( *pCur == '#' )
            while ( *pCur != '\n' )
                *pCur++ = ' ';
    
        // count the number of new lines and dots
        if ( *pCur == '\n' ) {
        if (*(pCur-1)=='\r') {
        // DOS(R) file support
        if (*(pCur-2)!='\\') nLines++;
        else {
            // rewind to backslash and overwrite with a space
            *(pCur-2) = ' ';
            *(pCur-1) = ' ';
            *pCur = ' ';
        }
        } else {
        // UNIX(TM) file support
        if (*(pCur-1)!='\\') nLines++;
        else {
            // rewind to backslash and overwrite with a space
            *(pCur-1) = ' ';
            *pCur = ' ';
        }
        }
    }
        else if ( *pCur == '.' )
            nDots++;
    }
    if ( pnDots )
        *pnDots = nDots; 
    if ( pnLines )
        *pnLines = nLines; 
}